

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_server_socket.c
# Opt level: O0

void test_enable_tfo(void)

{
  cio_error cVar1;
  undefined1 local_550 [4];
  cio_error err;
  cio_server_socket ss;
  cio_eventloop loop;
  
  cVar1 = cio_server_socket_init
                    ((cio_server_socket *)local_550,(cio_eventloop *)&ss.free_client,5,
                     CIO_ADDRESS_FAMILY_INET4,alloc_client,free_client,10,on_close);
  UnityAssertEqualNumber
            (0,(long)cVar1,"Initialization of server socket failed!",0x29c,UNITY_DISPLAY_STYLE_INT);
  cVar1 = cio_server_socket_set_tcp_fast_open((cio_server_socket *)local_550,true);
  UnityAssertEqualNumber
            (0,(long)cVar1,"Return value of cio_socket_set_tcp_fast_open not correct!",0x29f,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)setsockopt_fake.call_count,"setsockopt was not called!",0x2a0,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((long)(int)ss.impl.ev.context,(long)setsockopt_fake.arg0_val,
             "fd for setsockopt not correct!",0x2a1,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (6,(long)setsockopt_fake.arg1_val,"level for setsockopt not correct!",0x2a2,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0x17,(long)setsockopt_fake.arg2_val,"option name for setsockopt not correct!",0x2a3,
             UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_enable_tfo(void)
{
	struct cio_eventloop loop;
	struct cio_server_socket ss;

	enum cio_error err = cio_server_socket_init(&ss, &loop, 5, CIO_ADDRESS_FAMILY_INET4, alloc_client, free_client, 10, on_close);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Initialization of server socket failed!");

	err = cio_server_socket_set_tcp_fast_open(&ss, true);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Return value of cio_socket_set_tcp_fast_open not correct!");
	TEST_ASSERT_EQUAL_MESSAGE(1, setsockopt_fake.call_count, "setsockopt was not called!");
	TEST_ASSERT_EQUAL_MESSAGE(ss.impl.ev.fd, setsockopt_fake.arg0_val, "fd for setsockopt not correct!");
	TEST_ASSERT_EQUAL_MESSAGE(SOL_TCP, setsockopt_fake.arg1_val, "level for setsockopt not correct!");
	TEST_ASSERT_EQUAL_MESSAGE(TCP_FASTOPEN, setsockopt_fake.arg2_val, "option name for setsockopt not correct!");
}